

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.h
# Opt level: O0

void __thiscall xLearn::FFMScore::~FFMScore(FFMScore *this)

{
  void *in_RDI;
  
  ~FFMScore((FFMScore *)0x2447c8);
  operator_delete(in_RDI);
  return;
}

Assistant:

~FFMScore() { }